

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approximate_quantile.cpp
# Opt level: O1

void duckdb::ApproxQuantileListOperation<signed_char>::
     Finalize<duckdb::list_entry_t,duckdb::ApproxQuantileState>
               (ApproxQuantileState *state,list_entry_t *target,AggregateFinalizeData *finalize_data
               )

{
  AggregateInputData *this;
  FunctionData *pFVar1;
  data_ptr_t pdVar2;
  _func_int **pp_Var3;
  _func_int **pp_Var4;
  bool bVar5;
  Vector *pVVar6;
  idx_t iVar7;
  reference pvVar8;
  ulong uVar9;
  size_type __n;
  Value input;
  
  if (state->pos != 0) {
    this = finalize_data->input;
    optional_ptr<duckdb::FunctionData,_true>::CheckValid(&this->bind_data);
    pFVar1 = (this->bind_data).ptr;
    pVVar6 = ListVector::GetEntry(finalize_data->result);
    iVar7 = ListVector::GetListSize(finalize_data->result);
    ListVector::Reserve(finalize_data->result,
                        ((long)pFVar1[2]._vptr_FunctionData - (long)pFVar1[1]._vptr_FunctionData >>
                        2) + iVar7);
    pdVar2 = pVVar6->data;
    duckdb_tdigest::TDigest::process(state->h);
    target->offset = iVar7;
    pp_Var3 = pFVar1[2]._vptr_FunctionData;
    pp_Var4 = pFVar1[1]._vptr_FunctionData;
    uVar9 = (long)pp_Var3 - (long)pp_Var4 >> 2;
    target->length = uVar9;
    if (pp_Var3 != pp_Var4) {
      __n = 0;
      do {
        pvVar8 = vector<float,_true>::operator[]((vector<float,_true> *)(pFVar1 + 1),__n);
        input = duckdb_tdigest::TDigest::quantile(state->h,(double)*pvVar8);
        bVar5 = TryCast::Operation<double,signed_char>(input,(int8_t *)(pdVar2 + __n + iVar7),false)
        ;
        if (!bVar5) {
          pdVar2[__n + iVar7] = (input < 0.0) + '\x7f';
        }
        __n = __n + 1;
        uVar9 = target->length;
      } while (__n < uVar9);
    }
    ListVector::SetListSize(finalize_data->result,uVar9 + target->offset);
    return;
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, RESULT_TYPE &target, AggregateFinalizeData &finalize_data) {
		if (state.pos == 0) {
			finalize_data.ReturnNull();
			return;
		}

		D_ASSERT(finalize_data.input.bind_data);
		auto &bind_data = finalize_data.input.bind_data->template Cast<ApproximateQuantileBindData>();

		auto &result = ListVector::GetEntry(finalize_data.result);
		auto ridx = ListVector::GetListSize(finalize_data.result);
		ListVector::Reserve(finalize_data.result, ridx + bind_data.quantiles.size());
		auto rdata = FlatVector::GetData<CHILD_TYPE>(result);

		D_ASSERT(state.h);
		state.h->compress();

		auto &entry = target;
		entry.offset = ridx;
		entry.length = bind_data.quantiles.size();
		for (size_t q = 0; q < entry.length; ++q) {
			const auto &quantile = bind_data.quantiles[q];
			const auto &source = state.h->quantile(quantile);
			auto &target = rdata[ridx + q];
			ApproxQuantileCoding::Decode(source, target);
		}

		ListVector::SetListSize(finalize_data.result, entry.offset + entry.length);
	}